

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void fs_write_multiple_bufs(int add_flags)

{
  undefined1 auVar1 [16];
  uv_buf_t uVar2;
  uv_buf_t uVar3;
  uv_buf_t uVar4;
  uv_buf_t uVar5;
  int iVar6;
  __off64_t _Var7;
  undefined8 uVar8;
  char *pcVar9;
  undefined1 auVar10 [16];
  uv_buf_t uVar11;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar6 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  uVar11.len = iov.len;
  uVar11.base = iov.base;
  auVar1._8_8_ = local_28._8_8_;
  auVar1._0_8_ = local_28._0_8_;
  auVar10._8_8_ = local_38._8_8_;
  auVar10._0_8_ = local_38._0_8_;
  if (iVar6 < 0) {
    pcVar9 = "r >= 0";
    uVar8 = 0xbcd;
  }
  else if (open_req1.result._4_4_ < 0) {
    pcVar9 = "open_req1.result >= 0";
    uVar8 = 0xbce;
    local_38 = auVar10;
    local_28 = auVar1;
    iov = uVar11;
  }
  else {
    uv_fs_req_cleanup(&open_req1);
    local_38 = uv_buf_init(test_buf,0xd);
    local_28 = uv_buf_init(test_buf2,0xf);
    iVar6 = uv_fs_write(0,&write_req,(int)open_req1.result,local_38,2,0,0);
    uVar5.len = iov.len;
    uVar5.base = iov.base;
    if (iVar6 < 0) {
      pcVar9 = "r >= 0";
      uVar8 = 0xbd4;
    }
    else if (write_req.result < 0) {
      pcVar9 = "write_req.result >= 0";
      uVar8 = 0xbd5;
      iov = uVar5;
    }
    else {
      uv_fs_req_cleanup(&write_req);
      iVar6 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
      uVar4.len = iov.len;
      uVar4.base = iov.base;
      if (iVar6 == 0) {
        if (close_req.result == 0) {
          uv_fs_req_cleanup(&close_req);
          iVar6 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
          uVar3.len = iov.len;
          uVar3.base = iov.base;
          if (iVar6 < 0) {
            pcVar9 = "r >= 0";
            uVar8 = 0xbdf;
          }
          else if (open_req1.result._4_4_ < 0) {
            pcVar9 = "open_req1.result >= 0";
            uVar8 = 0xbe0;
            iov = uVar3;
          }
          else {
            uv_fs_req_cleanup(&open_req1);
            buf[0x10] = '\0';
            buf[0x11] = '\0';
            buf[0x12] = '\0';
            buf[0x13] = '\0';
            buf[0x14] = '\0';
            buf[0x15] = '\0';
            buf[0x16] = '\0';
            buf[0x17] = '\0';
            buf[0x18] = '\0';
            buf[0x19] = '\0';
            buf[0x1a] = '\0';
            buf[0x1b] = '\0';
            buf[0x1c] = '\0';
            buf[0x1d] = '\0';
            buf[0x1e] = '\0';
            buf[0x1f] = '\0';
            buf[0] = '\0';
            buf[1] = '\0';
            buf[2] = '\0';
            buf[3] = '\0';
            buf[4] = '\0';
            buf[5] = '\0';
            buf[6] = '\0';
            buf[7] = '\0';
            buf[8] = '\0';
            buf[9] = '\0';
            buf[10] = '\0';
            buf[0xb] = '\0';
            buf[0xc] = '\0';
            buf[0xd] = '\0';
            buf[0xe] = '\0';
            buf[0xf] = '\0';
            buf2[0] = '\0';
            buf2[1] = '\0';
            buf2[2] = '\0';
            buf2[3] = '\0';
            buf2[4] = '\0';
            buf2[5] = '\0';
            buf2[6] = '\0';
            buf2[7] = '\0';
            buf2[8] = '\0';
            buf2[9] = '\0';
            buf2[10] = '\0';
            buf2[0xb] = '\0';
            buf2[0xc] = '\0';
            buf2[0xd] = '\0';
            buf2[0xe] = '\0';
            buf2[0xf] = '\0';
            buf2[0x10] = '\0';
            buf2[0x11] = '\0';
            buf2[0x12] = '\0';
            buf2[0x13] = '\0';
            buf2[0x14] = '\0';
            buf2[0x15] = '\0';
            buf2[0x16] = '\0';
            buf2[0x17] = '\0';
            buf2[0x18] = '\0';
            buf2[0x19] = '\0';
            buf2[0x1a] = '\0';
            buf2[0x1b] = '\0';
            buf2[0x1c] = '\0';
            buf2[0x1d] = '\0';
            buf2[0x1e] = '\0';
            buf2[0x1f] = '\0';
            auVar10 = uv_buf_init(buf,0xd);
            local_38 = auVar10;
            auVar10 = uv_buf_init(buf2);
            local_28 = auVar10;
            _Var7 = lseek64((int)open_req1.result,0,1);
            if (_Var7 == 0) {
              iVar6 = uv_fs_read(0,&read_req,(int)open_req1.result,local_38,2,0xffffffffffffffff,0);
              uVar2.len = iov.len;
              uVar2.base = iov.base;
              if (iVar6 < 0) {
                pcVar9 = "r >= 0";
                uVar8 = 0xbea;
              }
              else if (read_req.result == 0x1c) {
                iVar6 = strcmp(buf,test_buf);
                if (iVar6 == 0) {
                  iVar6 = strcmp(buf2,test_buf2);
                  if (iVar6 == 0) {
                    uv_fs_req_cleanup(&read_req);
                    iov = (uv_buf_t)uv_buf_init(buf,0x20);
                    iVar6 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff,0
                                      );
                    if (iVar6 == 0) {
                      if (read_req.result == 0) {
                        uv_fs_req_cleanup(&read_req);
                        auVar10 = uv_buf_init(buf,0xd);
                        local_38 = auVar10;
                        auVar10 = uv_buf_init(buf2,0xf);
                        local_28 = auVar10;
                        iVar6 = uv_fs_read(0,&read_req,(int)open_req1.result,local_38,2,0,0);
                        if (iVar6 < 0) {
                          pcVar9 = "r >= 0";
                          uVar8 = 0xbfa;
                        }
                        else {
                          if (read_req.result != 0x1c) {
                            if (read_req.result != 0xd) {
                              pcVar9 = "read_req.result == sizeof(test_buf) + sizeof(test_buf2)";
                              uVar8 = 0xc02;
                              goto LAB_00129637;
                            }
                            uv_fs_req_cleanup(&read_req);
                            iVar6 = uv_fs_read(0,&read_req,(int)open_req1.result,local_28,1,
                                               read_req.result,0);
                            if (iVar6 < 0) {
                              pcVar9 = "r >= 0";
                              uVar8 = 0xbff;
                              goto LAB_00129637;
                            }
                            if (read_req.result != 0xf) {
                              pcVar9 = "read_req.result == sizeof(test_buf2)";
                              uVar8 = 0xc00;
                              goto LAB_00129637;
                            }
                          }
                          iVar6 = strcmp(buf,test_buf);
                          if (iVar6 == 0) {
                            iVar6 = strcmp(buf2,test_buf2);
                            if (iVar6 == 0) {
                              uv_fs_req_cleanup(&read_req);
                              uVar11 = (uv_buf_t)uv_buf_init(buf,0x20);
                              iov = uVar11;
                              iVar6 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0x1c,0);
                              if (iVar6 == 0) {
                                if (read_req.result == 0) {
                                  uv_fs_req_cleanup(&read_req);
                                  iVar6 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
                                  if (iVar6 == 0) {
                                    if (close_req.result == 0) {
                                      uv_fs_req_cleanup(&close_req);
                                      unlink("test_file");
                                      return;
                                    }
                                    pcVar9 = "close_req.result == 0";
                                    uVar8 = 0xc11;
                                  }
                                  else {
                                    pcVar9 = "r == 0";
                                    uVar8 = 0xc10;
                                  }
                                }
                                else {
                                  pcVar9 = "read_req.result == 0";
                                  uVar8 = 0xc0c;
                                }
                              }
                              else {
                                pcVar9 = "r == 0";
                                uVar8 = 0xc0b;
                              }
                            }
                            else {
                              pcVar9 = "strcmp(buf2, test_buf2) == 0";
                              uVar8 = 0xc05;
                            }
                          }
                          else {
                            pcVar9 = "strcmp(buf, test_buf) == 0";
                            uVar8 = 0xc04;
                          }
                        }
                      }
                      else {
                        pcVar9 = "read_req.result == 0";
                        uVar8 = 0xbf3;
                      }
                    }
                    else {
                      pcVar9 = "r == 0";
                      uVar8 = 0xbf2;
                    }
                  }
                  else {
                    pcVar9 = "strcmp(buf2, test_buf2) == 0";
                    uVar8 = 0xbed;
                  }
                }
                else {
                  pcVar9 = "strcmp(buf, test_buf) == 0";
                  uVar8 = 0xbec;
                }
              }
              else {
                pcVar9 = "read_req.result == sizeof(test_buf) + sizeof(test_buf2)";
                uVar8 = 0xbeb;
                iov = uVar2;
              }
            }
            else {
              pcVar9 = "lseek(open_req1.result, 0, SEEK_CUR) == 0";
              uVar8 = 0xbe8;
            }
          }
        }
        else {
          pcVar9 = "close_req.result == 0";
          uVar8 = 0xbda;
          iov = uVar4;
        }
      }
      else {
        pcVar9 = "r == 0";
        uVar8 = 0xbd9;
      }
    }
  }
LAB_00129637:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar8,pcVar9);
  abort();
}

Assistant:

static void fs_write_multiple_bufs(int add_flags) {
  uv_buf_t iovs[2];
  int r;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &open_req1, "test_file",
      O_WRONLY | O_CREAT | add_flags, S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iovs[0] = uv_buf_init(test_buf, sizeof(test_buf));
  iovs[1] = uv_buf_init(test_buf2, sizeof(test_buf2));
  r = uv_fs_write(NULL, &write_req, open_req1.result, iovs, 2, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(write_req.result >= 0);
  uv_fs_req_cleanup(&write_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDONLY | add_flags, 0,
      NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  memset(buf, 0, sizeof(buf));
  memset(buf2, 0, sizeof(buf2));
  /* Read the strings back to separate buffers. */
  iovs[0] = uv_buf_init(buf, sizeof(test_buf));
  iovs[1] = uv_buf_init(buf2, sizeof(test_buf2));
  ASSERT(lseek(open_req1.result, 0, SEEK_CUR) == 0);
  r = uv_fs_read(NULL, &read_req, open_req1.result, iovs, 2, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(read_req.result == sizeof(test_buf) + sizeof(test_buf2));
  ASSERT(strcmp(buf, test_buf) == 0);
  ASSERT(strcmp(buf2, test_buf2) == 0);
  uv_fs_req_cleanup(&read_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  /* Read the strings back to separate buffers. */
  iovs[0] = uv_buf_init(buf, sizeof(test_buf));
  iovs[1] = uv_buf_init(buf2, sizeof(test_buf2));
  r = uv_fs_read(NULL, &read_req, open_req1.result, iovs, 2, 0, NULL);
  ASSERT(r >= 0);
  if (read_req.result == sizeof(test_buf)) {
    /* Infer that preadv is not available. */
    uv_fs_req_cleanup(&read_req);
    r = uv_fs_read(NULL, &read_req, open_req1.result, &iovs[1], 1, read_req.result, NULL);
    ASSERT(r >= 0);
    ASSERT(read_req.result == sizeof(test_buf2));
  } else {
    ASSERT(read_req.result == sizeof(test_buf) + sizeof(test_buf2));
  }
  ASSERT(strcmp(buf, test_buf) == 0);
  ASSERT(strcmp(buf2, test_buf2) == 0);
  uv_fs_req_cleanup(&read_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1,
                 sizeof(test_buf) + sizeof(test_buf2), NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
}